

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

istream * operator>>(istream *in,lda_math_mode *mmode)

{
  bool bVar1;
  invalid_option_value *this;
  undefined4 *in_RSI;
  istream *in_RDI;
  string token;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string local_30 [32];
  undefined4 *local_10;
  istream *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::__cxx11::string::string(local_30);
  std::operator>>(local_8,local_30);
  bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  if (bVar1) {
    *local_10 = 0;
  }
  else {
    bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if ((bVar1) ||
       (bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98), bVar1)) {
      *local_10 = 1;
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      if ((!bVar1) &&
         (bVar1 = std::operator==(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98), !bVar1)) {
        this = (invalid_option_value *)__cxa_allocate_exception(0xc0);
        boost::program_options::invalid_option_value::invalid_option_value(this,local_30);
        __cxa_throw(this,&boost::program_options::invalid_option_value::typeinfo,
                    boost::program_options::invalid_option_value::~invalid_option_value);
      }
      *local_10 = 2;
    }
  }
  std::__cxx11::string::~string(local_30);
  return local_8;
}

Assistant:

std::istream &operator>>(std::istream &in, lda_math_mode &mmode)
{
  using namespace boost::program_options;

  std::string token;
  in >> token;
  if (token == "simd")
    mmode = USE_SIMD;
  else if (token == "accuracy" || token == "precise")
    mmode = USE_PRECISE;
  else if (token == "fast-approx" || token == "approx")
    mmode = USE_FAST_APPROX;
  else
    throw boost::program_options::invalid_option_value(token);
  return in;
}